

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlInitialize(Ssw_Sml_t *p,int fInit)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  int fInit_local;
  Ssw_Sml_t *p_local;
  
  if (fInit == 0) {
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), local_24 < iVar1; local_24 = local_24 + 1
        ) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_24);
      Ssw_SmlAssignRandom(p,pAVar3);
    }
  }
  else {
    iVar1 = Aig_ManRegNum(p->pAig);
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x385,"void Ssw_SmlInitialize(Ssw_Sml_t *, int)");
    }
    iVar1 = Aig_ManRegNum(p->pAig);
    iVar2 = Aig_ManCiNum(p->pAig);
    if (iVar2 < iVar1) {
      __assert_fail("Aig_ManRegNum(p->pAig) <= Aig_ManCiNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x386,"void Ssw_SmlInitialize(Ssw_Sml_t *, int)");
    }
    for (local_24 = 0; iVar1 = Saig_ManPiNum(p->pAig), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_24);
      Ssw_SmlAssignRandom(p,pAVar3);
    }
    for (local_24 = 0; iVar1 = Saig_ManRegNum(p->pAig), local_24 < iVar1; local_24 = local_24 + 1) {
      p_00 = p->pAig->vCis;
      iVar1 = Saig_ManPiNum(p->pAig);
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_24 + iVar1);
      Ssw_SmlObjAssignConst(p,pAVar3,0,0);
    }
  }
  return;
}

Assistant:

void Ssw_SmlInitialize( Ssw_Sml_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i;
    if ( fInit )
    {
        assert( Aig_ManRegNum(p->pAig) > 0 );
        assert( Aig_ManRegNum(p->pAig) <= Aig_ManCiNum(p->pAig) );
        // assign random info for primary inputs
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandom( p, pObj );
        // assign the initial state for the latches
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, 0, 0 );
    }
    else
    {
        Aig_ManForEachCi( p->pAig, pObj, i )
            Ssw_SmlAssignRandom( p, pObj );
    }
}